

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

double crnlib::image_utils::compute_std_dev
                 (uint n,color_quad_u8 *pPixels,uint first_channel,uint num_channels)

{
  byte bVar1;
  uint uVar2;
  double dVar3;
  double var;
  double w;
  uint local_50;
  uint l_1;
  uint c;
  uint l;
  color_quad_u8 *cp;
  double dStack_38;
  uint i;
  double sum2;
  double sum;
  uint num_channels_local;
  uint first_channel_local;
  color_quad_u8 *pPixels_local;
  double dStack_10;
  uint n_local;
  
  if (n == 0) {
    dStack_10 = 0.0;
  }
  else {
    sum2 = 0.0;
    dStack_38 = 0.0;
    for (cp._4_4_ = 0; cp._4_4_ < n; cp._4_4_ = cp._4_4_ + 1) {
      if (num_channels == 0) {
        uVar2 = color_quad<unsigned_char,_int>::get_luma(pPixels + cp._4_4_);
        sum2 = sum2 + (double)uVar2;
        dStack_38 = (double)(uVar2 * uVar2) + dStack_38;
      }
      else {
        for (local_50 = 0; local_50 < num_channels; local_50 = local_50 + 1) {
          bVar1 = color_quad<unsigned_char,_int>::operator[]
                            (pPixels + cp._4_4_,first_channel + local_50);
          uVar2 = (uint)bVar1;
          sum2 = sum2 + (double)uVar2;
          dStack_38 = (double)(uVar2 * uVar2) + dStack_38;
        }
      }
    }
    uVar2 = math::maximum<unsigned_int>(1,num_channels);
    dVar3 = sum2 / (double)(uVar2 * n);
    dVar3 = math::maximum<double>(-dVar3 * dVar3 + dStack_38 / (double)(uVar2 * n),0.0);
    dStack_10 = sqrt(dVar3);
  }
  return dStack_10;
}

Assistant:

double compute_std_dev(uint n, const color_quad_u8* pPixels, uint first_channel, uint num_channels)
        {
            if (!n)
            {
                return 0.0f;
            }

            double sum = 0.0f;
            double sum2 = 0.0f;

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& cp = pPixels[i];

                if (!num_channels)
                {
                    uint l = cp.get_luma();
                    sum += l;
                    sum2 += l * l;
                }
                else
                {
                    for (uint c = 0; c < num_channels; c++)
                    {
                        uint l = cp[first_channel + c];
                        sum += l;
                        sum2 += l * l;
                    }
                }
            }

            double w = math::maximum(1U, num_channels) * n;
            sum /= w;
            sum2 /= w;

            double var = sum2 - sum * sum;
            var = math::maximum<double>(var, 0.0f);

            return sqrt(var);
        }